

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::Message::FindInitializationErrors
          (Message *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  internal::ReflectionOps::FindInitializationErrors(this,&local_38,errors);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Message::FindInitializationErrors(std::vector<string>* errors) const {
  return ReflectionOps::FindInitializationErrors(*this, "", errors);
}